

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

_incompatible_texture_target_pairs *
gl4cts::TextureViewUtilities::getIllegalTextureAndViewTargetCombinations(void)

{
  bool bVar1;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *in_RDI;
  pair<unsigned_int,_unsigned_int> local_3c [3];
  GLenum local_24;
  uint local_20;
  GLenum view_texture_target;
  uint n_view_texture_target;
  GLenum parent_texture_target;
  uint n_parent_texture_target;
  _incompatible_texture_target_pairs *result;
  
  parent_texture_target._3_1_ = 0;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector(in_RDI);
  for (n_view_texture_target = 0; n_view_texture_target < 0xb;
      n_view_texture_target = n_view_texture_target + 1) {
    view_texture_target = *(GLenum *)(valid_texture_targets + (ulong)n_view_texture_target * 4);
    for (local_20 = 0; local_20 < 0xb; local_20 = local_20 + 1) {
      local_24 = *(GLenum *)(valid_texture_targets + (ulong)local_20 * 4);
      bVar1 = isLegalTextureTargetForTextureView(view_texture_target,local_24);
      if (!bVar1) {
        std::pair<unsigned_int,_unsigned_int>::pair<unsigned_int_&,_unsigned_int_&,_true>
                  (local_3c,&view_texture_target,&local_24);
        std::
        vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ::push_back(in_RDI,local_3c);
      }
    }
  }
  return in_RDI;
}

Assistant:

TextureViewUtilities::_incompatible_texture_target_pairs TextureViewUtilities::
	getIllegalTextureAndViewTargetCombinations()
{
	_incompatible_texture_target_pairs result;

	/* Iterate through all combinations of texture targets and store those that are
	 * reported as invalid
	 */
	for (unsigned int n_parent_texture_target = 0; n_parent_texture_target < n_valid_texture_targets;
		 ++n_parent_texture_target)
	{
		glw::GLenum parent_texture_target = valid_texture_targets[n_parent_texture_target];

		for (unsigned int n_view_texture_target = 0; n_view_texture_target < n_valid_texture_targets;
			 ++n_view_texture_target)
		{
			glw::GLenum view_texture_target = valid_texture_targets[n_view_texture_target];

			if (!isLegalTextureTargetForTextureView(parent_texture_target, view_texture_target))
			{
				result.push_back(_internalformat_pair(parent_texture_target, view_texture_target));
			}
		} /* for (all texture targets considered for views) */
	}	 /* for (all texture targets considered for parent texture) */

	return result;
}